

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateDeferredContextImpl<>
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,IDeviceContext **ppContext)

{
  DeviceContextVkImpl *pObj;
  anon_class_24_3_c3e95c83 ConstructObject;
  uint __val;
  size_type sVar1;
  reference pvVar2;
  size_t sVar3;
  Char *pCVar4;
  char (*Args_1) [40];
  bool local_191;
  undefined1 local_188 [8];
  string msg;
  DeviceContextDesc local_150;
  undefined1 local_138 [8];
  DeviceContextDesc Desc;
  string local_100;
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string CtxName;
  uint local_24;
  Uint32 ContextId;
  Uint32 CtxIndex;
  lock_guard<std::mutex> Guard;
  IDeviceContext **ppContext_local;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *this_local;
  
  Guard._M_device = (mutex_type *)ppContext;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&ContextId,&this->m_DeferredCtxMtx);
  local_24 = 0;
  while( true ) {
    sVar1 = std::
            vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
            ::size(&this->m_wpDeferredContexts);
    local_191 = false;
    if (local_24 < sVar1) {
      pvVar2 = std::
               vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
               ::operator[](&this->m_wpDeferredContexts,(ulong)local_24);
      local_191 = RefCntWeakPtr<Diligent::DeviceContextVkImpl>::IsValid(pvVar2);
    }
    if (local_191 == false) break;
    local_24 = local_24 + 1;
  }
  sVar3 = GetNumImmediateContexts(this);
  __val = (int)sVar3 + local_24;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"Deferred context ",&local_d9);
  std::__cxx11::to_string(&local_100,local_24);
  std::operator+(&local_b8,&local_d8,&local_100);
  std::operator+(&local_98,&local_b8," (ContextId: ");
  std::__cxx11::to_string((string *)(Desc.TextureCopyGranularity + 1),__val);
  std::operator+(&local_78,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (Desc.TextureCopyGranularity + 1));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,")");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)(Desc.TextureCopyGranularity + 1));
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  pCVar4 = (Char *)std::__cxx11::string::c_str();
  DeviceContextDesc::DeviceContextDesc(&local_150);
  DeviceContextDesc::DeviceContextDesc
            ((DeviceContextDesc *)local_138,pCVar4,COMMAND_QUEUE_TYPE_UNKNOWN,true,__val,0xff);
  ConstructObject.Desc = (DeviceContextDesc *)local_138;
  ConstructObject.this = this;
  ConstructObject.ppContext = (IDeviceContext ***)&Guard;
  msg.field_2._8_8_ = this;
  CreateDeviceObject<Diligent::IDeviceContext,Diligent::DeviceContextDesc,Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateDeferredContextImpl<>(Diligent::IDeviceContext**)::_lambda()_1_>
            (this,"Device context",(DeviceContextDesc *)local_138,(IDeviceContext **)Guard._M_device
             ,ConstructObject);
  if (((Guard._M_device)->super___mutex_base)._M_mutex.__align != 0) {
    sVar1 = std::
            vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
            ::size(&this->m_wpDeferredContexts);
    if (sVar1 <= local_24) {
      Args_1 = (char (*) [40])
               std::
               vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
               ::size(&this->m_wpDeferredContexts);
      if ((char (*) [40])(ulong)local_24 != Args_1) {
        FormatString<char[26],char[40]>
                  ((string *)local_188,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"CtxIndex == m_wpDeferredContexts.size()",Args_1);
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"CreateDeferredContextImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                   ,0x2a1);
        std::__cxx11::string::~string((string *)local_188);
      }
      std::
      vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
      ::resize(&this->m_wpDeferredContexts,(ulong)(local_24 + 1));
    }
    pObj = (DeviceContextVkImpl *)((Guard._M_device)->super___mutex_base)._M_mutex.__align;
    pvVar2 = std::
             vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
             ::operator[](&this->m_wpDeferredContexts,(ulong)local_24);
    RefCntWeakPtr<Diligent::DeviceContextVkImpl>::operator=(pvVar2,pObj);
  }
  std::__cxx11::string::~string((string *)local_58);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&ContextId);
  return;
}

Assistant:

void CreateDeferredContextImpl(IDeviceContext** ppContext, const ExtraArgsType&... ExtraArgs)
    {
        std::lock_guard<std::mutex> Guard{m_DeferredCtxMtx};

        Uint32 CtxIndex = 0;
        while (CtxIndex < m_wpDeferredContexts.size() && m_wpDeferredContexts[CtxIndex].IsValid())
            ++CtxIndex;

        const Uint32      ContextId = static_cast<Uint32>(GetNumImmediateContexts()) + CtxIndex;
        const std::string CtxName   = std::string{"Deferred context "} + std::to_string(CtxIndex) + " (ContextId: " + std::to_string(ContextId) + ")";
        DeviceContextDesc Desc{
            CtxName.c_str(),
            COMMAND_QUEUE_TYPE_UNKNOWN,
            true, // IsDeferred
            ContextId,
        };

        CreateDeviceObject("Device context", Desc, ppContext,
                           [&]() //
                           {
                               DeviceContextImplType* pCtxImpl = NEW_RC_OBJ(GetRawAllocator(), "DeviceContext instance", DeviceContextImplType)(
                                   static_cast<RenderDeviceImplType*>(this),
                                   Desc,
                                   ExtraArgs...);
                               pCtxImpl->QueryInterface(IID_DeviceContext, reinterpret_cast<IObject**>(ppContext));
                           });

        if (*ppContext != nullptr)
        {
            if (CtxIndex >= m_wpDeferredContexts.size())
            {
                VERIFY_EXPR(CtxIndex == m_wpDeferredContexts.size());
                m_wpDeferredContexts.resize(CtxIndex + 1);
            }

            m_wpDeferredContexts[CtxIndex] = static_cast<DeviceContextImplType*>(*ppContext);
        }
    }